

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

OPJ_BOOL opj_t2_read_packet_header
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_tcp_t *p_tcp,opj_pi_iterator_t *p_pi,
                   OPJ_BOOL *p_is_data_present,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                   OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info,opj_event_mgr_t *p_manager
                   )

{
  uint uVar1;
  opj_cp_t *poVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_seg_t *poVar5;
  OPJ_BYTE *pOVar6;
  bool bVar7;
  OPJ_BOOL OVar8;
  int iVar9;
  OPJ_UINT32 OVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  opj_bio_t *bio;
  OPJ_UINT32 *pOVar13;
  ulong uVar14;
  ptrdiff_t pVar15;
  int iVar16;
  char *pcVar17;
  opj_tcd_band_t *poVar18;
  OPJ_UINT32 i;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  OPJ_BYTE **ppOVar24;
  opj_tcd_cblk_dec_t *cblk;
  OPJ_BYTE *pOVar25;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_length;
  int local_78;
  OPJ_BYTE *local_68;
  uint local_60;
  OPJ_UINT32 local_5c;
  OPJ_BYTE **local_58;
  OPJ_BOOL *local_50;
  opj_tcd_band_t *local_48;
  OPJ_BYTE *local_40;
  OPJ_UINT32 local_34;
  
  poVar2 = p_t2->cp;
  uVar21 = p_pi->resno;
  poVar3 = p_tile->comps[p_pi->compno].resolutions;
  local_68 = p_src_data;
  local_50 = p_is_data_present;
  if ((p_pi->layno == 0) && (poVar3[uVar21].numbands != 0)) {
    poVar18 = poVar3[uVar21].bands;
    uVar19 = 0;
    do {
      OVar8 = opj_tcd_is_band_empty(poVar18);
      if (OVar8 == 0) {
        uVar1 = p_pi->precno;
        uVar22 = poVar18->precincts_data_size / 0x38;
        if (uVar1 < uVar22) {
          poVar4 = poVar18->precincts;
          opj_tgt_reset(poVar4[uVar1].incltree);
          opj_tgt_reset(poVar4[uVar1].imsbtree);
          iVar9 = poVar4[uVar1].ch * poVar4[uVar1].cw;
          if (iVar9 != 0) {
            pOVar13 = &(poVar4[uVar1].cblks.enc)->data_size;
            do {
              *(undefined8 *)(pOVar13 + -1) = 0;
              pOVar13 = pOVar13 + 0x12;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
        }
        else {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,1,"Invalid precinct\n");
        }
        if (uVar22 <= uVar1) {
          return 0;
        }
      }
      poVar18 = poVar18 + 1;
      uVar19 = uVar19 + 1;
    } while (uVar19 < poVar3[uVar21].numbands);
  }
  if ((p_tcp->csty & 2) != 0) {
    if (p_max_length < 6) {
      pcVar17 = "Not enough space for expected SOP marker\n";
    }
    else {
      if ((*p_src_data == 0xff) && (p_src_data[1] == 0x91)) {
        local_68 = p_src_data + 6;
        goto LAB_001361e4;
      }
      pcVar17 = "Expected SOP marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar17);
  }
LAB_001361e4:
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
    return 0;
  }
  local_78 = (int)p_src_data;
  if ((poVar2->field_0x90 & 1) == 0) {
    if ((p_tcp->field_0x1638 & 2) == 0) {
      ppOVar24 = &local_68;
      pOVar13 = &local_34;
      local_34 = (p_max_length + local_78) - (int)local_68;
      pOVar25 = local_68;
    }
    else {
      ppOVar24 = &p_tcp->ppt_data;
      pOVar25 = p_tcp->ppt_data;
      pOVar13 = &p_tcp->ppt_len;
    }
  }
  else {
    ppOVar24 = &poVar2->ppm_data;
    pOVar25 = poVar2->ppm_data;
    pOVar13 = &poVar2->ppm_len;
  }
  opj_bio_init_dec(bio,pOVar25,*pOVar13);
  OVar10 = opj_bio_read(bio,1);
  if (OVar10 != 0) {
    local_58 = ppOVar24;
    local_40 = pOVar25;
    if (poVar3[uVar21].numbands != 0) {
      poVar18 = poVar3[uVar21].bands;
      uVar19 = 0;
      do {
        uVar1 = p_pi->precno;
        poVar4 = poVar18->precincts;
        local_60 = uVar19;
        local_48 = poVar18;
        OVar8 = opj_tcd_is_band_empty(poVar18);
        iVar9 = 10;
        if (OVar8 == 0) {
          local_5c = poVar4[uVar1].ch * poVar4[uVar1].cw;
          if (local_5c != 0) {
            cblk = poVar4[uVar1].cblks.dec;
            OVar10 = 0;
            do {
              if (cblk->numsegs == 0) {
                OVar11 = opj_tgt_decode(bio,poVar4[uVar1].incltree,OVar10,p_pi->layno + 1);
              }
              else {
                OVar11 = opj_bio_read(bio,1);
              }
              if (OVar11 == 0) {
                cblk->numnewpasses = 0;
                cblk = cblk + 1;
                iVar9 = 0xd;
              }
              else {
                if (cblk->numsegs == 0) {
                  iVar9 = 0;
                  do {
                    OVar11 = opj_tgt_decode(bio,poVar4[uVar1].imsbtree,OVar10,iVar9);
                    iVar9 = iVar9 + 1;
                  } while (OVar11 == 0);
                  cblk->numbps = (local_48->numbps - iVar9) + 2;
                  cblk->numlenbits = 3;
                }
                OVar12 = 1;
                OVar11 = opj_bio_read(bio,1);
                if (OVar11 != 0) {
                  OVar11 = opj_bio_read(bio,1);
                  if (OVar11 == 0) {
                    OVar12 = 2;
                  }
                  else {
                    OVar12 = opj_bio_read(bio,2);
                    if (OVar12 == 3) {
                      OVar12 = opj_bio_read(bio,5);
                      if (OVar12 == 0x1f) {
                        OVar12 = opj_bio_read(bio,7);
                        OVar12 = OVar12 + 0x25;
                      }
                      else {
                        OVar12 = OVar12 + 6;
                      }
                    }
                    else {
                      OVar12 = OVar12 + 3;
                    }
                  }
                }
                cblk->numnewpasses = OVar12;
                iVar9 = -1;
                do {
                  OVar11 = opj_bio_read(bio,1);
                  iVar9 = iVar9 + 1;
                } while (OVar11 != 0);
                cblk->numlenbits = cblk->numlenbits + iVar9;
                uVar19 = cblk->numsegs;
                if (uVar19 == 0) {
                  uVar23 = 0;
                  iVar9 = opj_t2_init_seg(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_00136487:
                  if (iVar9 == 0) {
                    opj_bio_destroy(bio);
LAB_00136561:
                    iVar9 = 1;
                    goto LAB_00136570;
                  }
                }
                else {
                  uVar23 = (ulong)(uVar19 - 1);
                  if (cblk->segs[uVar23].numpasses == cblk->segs[uVar23].maxpasses) {
                    iVar9 = opj_t2_init_seg(cblk,uVar19,p_tcp->tccps[p_pi->compno].cblksty,0);
                    uVar23 = (ulong)uVar19;
                    goto LAB_00136487;
                  }
                }
                uVar20 = (ulong)cblk->numnewpasses;
                do {
                  poVar5 = cblk->segs;
                  uVar19 = poVar5[uVar23].maxpasses - poVar5[uVar23].numpasses;
                  iVar9 = (int)uVar20;
                  uVar14 = (ulong)uVar19;
                  if (iVar9 <= (int)uVar19) {
                    uVar14 = uVar20;
                  }
                  poVar5[uVar23].numnewpasses = (uint)uVar14;
                  iVar16 = 0;
                  if (1 < (uint)uVar14) {
                    iVar16 = 0;
                    do {
                      iVar16 = iVar16 + 1;
                      uVar19 = (uint)uVar14;
                      uVar14 = uVar14 >> 1;
                    } while (3 < uVar19);
                  }
                  uVar19 = iVar16 + cblk->numlenbits;
                  if (uVar19 < 0x21) {
                    OVar11 = opj_bio_read(bio,uVar19);
                    poVar5 = cblk->segs;
                    poVar5[uVar23].newlen = OVar11;
                    bVar7 = true;
                    OVar11 = poVar5[uVar23].numnewpasses;
                    uVar19 = iVar9 - OVar11;
                    uVar20 = (ulong)uVar19;
                    if (uVar19 != 0 && (int)OVar11 <= iVar9) {
                      uVar19 = (int)uVar23 + 1;
                      uVar23 = (ulong)uVar19;
                      OVar8 = opj_t2_init_seg(cblk,uVar19,p_tcp->tccps[p_pi->compno].cblksty,0);
                      if (OVar8 == 0) goto LAB_001364eb;
                    }
                  }
                  else {
                    opj_event_msg((opj_event_mgr_t *)p_pack_info,1,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n");
LAB_001364eb:
                    opj_bio_destroy(bio);
                    bVar7 = false;
                  }
                  if (!bVar7) goto LAB_00136561;
                } while (0 < (int)uVar20);
                cblk = cblk + 1;
                iVar9 = 0;
              }
LAB_00136570:
              if ((iVar9 != 0xd) && (iVar9 != 0)) goto LAB_00136589;
              OVar10 = OVar10 + 1;
            } while (OVar10 != local_5c);
          }
          iVar9 = 0;
        }
LAB_00136589:
        if ((iVar9 != 10) && (iVar9 != 0)) {
          return 0;
        }
        uVar19 = local_60 + 1;
        poVar18 = local_48 + 1;
      } while (uVar19 < poVar3[uVar21].numbands);
    }
    OVar8 = opj_bio_inalign(bio);
    if (OVar8 != 0) {
      pVar15 = opj_bio_numbytes(bio);
      pOVar25 = local_40 + pVar15;
      opj_bio_destroy(bio);
      ppOVar24 = local_58;
      if ((p_tcp->csty & 4) != 0) {
        if ((*(int *)local_58 - (int)pOVar25) + *pOVar13 < 2) {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,2,
                        "Not enough space for expected EPH marker\n");
        }
        else if ((*pOVar25 == 0xff) && (pOVar25[1] == 0x92)) {
          pOVar25 = pOVar25 + 2;
        }
        else {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,2,"Expected EPH marker\n");
        }
      }
      pOVar6 = *ppOVar24;
      uVar21 = (int)pOVar25 - (int)pOVar6;
      *pOVar13 = *pOVar13 - uVar21;
      *ppOVar24 = pOVar6 + uVar21;
      *local_50 = 1;
      *p_data_read = (int)local_68 - local_78;
      return 1;
    }
    opj_bio_destroy(bio);
    return 0;
  }
  opj_bio_inalign(bio);
  pVar15 = opj_bio_numbytes(bio);
  pOVar25 = pOVar25 + pVar15;
  opj_bio_destroy(bio);
  if ((p_tcp->csty & 4) != 0) {
    if ((*(int *)ppOVar24 - (int)pOVar25) + *pOVar13 < 2) {
      pcVar17 = "Not enough space for expected EPH marker\n";
    }
    else {
      if ((*pOVar25 == 0xff) && (pOVar25[1] == 0x92)) {
        pOVar25 = pOVar25 + 2;
        goto LAB_001366de;
      }
      pcVar17 = "Expected EPH marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar17);
  }
LAB_001366de:
  pOVar6 = *ppOVar24;
  uVar21 = (int)pOVar25 - (int)pOVar6;
  *pOVar13 = *pOVar13 - uVar21;
  *ppOVar24 = pOVar6 + uVar21;
  *local_50 = 0;
  *p_data_read = (int)local_68 - local_78;
  return 1;
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_header(opj_t2_t* p_t2,
        opj_tcd_tile_t *p_tile,
        opj_tcp_t *p_tcp,
        opj_pi_iterator_t *p_pi,
        OPJ_BOOL * p_is_data_present,
        OPJ_BYTE *p_src_data,
        OPJ_UINT32 * p_data_read,
        OPJ_UINT32 p_max_length,
        opj_packet_info_t *p_pack_info,
        opj_event_mgr_t *p_manager)

{
    /* loop */
    OPJ_UINT32 bandno, cblkno;
    OPJ_UINT32 l_nb_code_blocks;
    OPJ_UINT32 l_remaining_length;
    OPJ_UINT32 l_header_length;
    OPJ_UINT32 * l_modified_length_ptr = 00;
    OPJ_BYTE *l_current_data = p_src_data;
    opj_cp_t *l_cp = p_t2->cp;
    opj_bio_t *l_bio = 00;  /* BIO component */
    opj_tcd_band_t *l_band = 00;
    opj_tcd_cblk_dec_t* l_cblk = 00;
    opj_tcd_resolution_t* l_res =
        &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

    OPJ_BYTE *l_header_data = 00;
    OPJ_BYTE **l_header_data_start = 00;

    OPJ_UINT32 l_present;

    if (p_pi->layno == 0) {
        l_band = l_res->bands;

        /* reset tagtrees */
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
            if (!opj_tcd_is_band_empty(l_band)) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];
                if (!(p_pi->precno < (l_band->precincts_data_size / sizeof(
                                          opj_tcd_precinct_t)))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct\n");
                    return OPJ_FALSE;
                }


                opj_tgt_reset(l_prc->incltree);
                opj_tgt_reset(l_prc->imsbtree);
                l_cblk = l_prc->cblks.dec;

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                    l_cblk->numsegs = 0;
                    l_cblk->real_num_segs = 0;
                    ++l_cblk;
                }
            }

            ++l_band;
        }
    }

    /* SOP markers */

    if (p_tcp->csty & J2K_CP_CSTY_SOP) {
        if (p_max_length < 6) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected SOP marker\n");
        } else if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected SOP marker\n");
        } else {
            l_current_data += 6;
        }

        /** TODO : check the Nsop value */
    }

    /*
    When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
    This part deal with this caracteristic
    step 1: Read packet header in the saved structure
    step 2: Return to codestream for decoding
    */

    l_bio = opj_bio_create();
    if (! l_bio) {
        return OPJ_FALSE;
    }

    if (l_cp->ppm == 1) { /* PPM */
        l_header_data_start = &l_cp->ppm_data;
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(l_cp->ppm_len);

    } else if (p_tcp->ppt == 1) { /* PPT */
        l_header_data_start = &(p_tcp->ppt_data);
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(p_tcp->ppt_len);
    } else { /* Normal Case */
        l_header_data_start = &(l_current_data);
        l_header_data = *l_header_data_start;
        l_remaining_length = (OPJ_UINT32)(p_src_data + p_max_length - l_header_data);
        l_modified_length_ptr = &(l_remaining_length);
    }

    opj_bio_init_dec(l_bio, l_header_data, *l_modified_length_ptr);

    l_present = opj_bio_read(l_bio, 1);
    JAS_FPRINTF(stderr, "present=%d \n", l_present);
    if (!l_present) {
        /* TODO MSD: no test to control the output of this function*/
        opj_bio_inalign(l_bio);
        l_header_data += opj_bio_numbytes(l_bio);
        opj_bio_destroy(l_bio);

        /* EPH markers */
        if (p_tcp->csty & J2K_CP_CSTY_EPH) {
            if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                    *l_header_data_start)) < 2U) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Not enough space for expected EPH marker\n");
            } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
                opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
            } else {
                l_header_data += 2;
            }
        }

        l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
        *l_modified_length_ptr -= l_header_length;
        *l_header_data_start += l_header_length;

        /* << INDEX */
        /* End of packet header position. Currently only represents the distance to start of packet
           Will be updated later by incrementing with packet start value */
        if (p_pack_info) {
            p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
        }
        /* INDEX >> */

        * p_is_data_present = OPJ_FALSE;
        *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);
        return OPJ_TRUE;
    }

    l_band = l_res->bands;
    for (bandno = 0; bandno < l_res->numbands; ++bandno, ++l_band) {
        opj_tcd_precinct_t *l_prc = &(l_band->precincts[p_pi->precno]);

        if (opj_tcd_is_band_empty(l_band)) {
            continue;
        }

        l_nb_code_blocks = l_prc->cw * l_prc->ch;
        l_cblk = l_prc->cblks.dec;
        for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
            OPJ_UINT32 l_included, l_increment, l_segno;
            OPJ_INT32 n;

            /* if cblk not yet included before --> inclusion tagtree */
            if (!l_cblk->numsegs) {
                l_included = opj_tgt_decode(l_bio, l_prc->incltree, cblkno,
                                            (OPJ_INT32)(p_pi->layno + 1));
                /* else one bit */
            } else {
                l_included = opj_bio_read(l_bio, 1);
            }

            /* if cblk not included */
            if (!l_included) {
                l_cblk->numnewpasses = 0;
                ++l_cblk;
                JAS_FPRINTF(stderr, "included=%d \n", l_included);
                continue;
            }

            /* if cblk not yet included --> zero-bitplane tagtree */
            if (!l_cblk->numsegs) {
                OPJ_UINT32 i = 0;

                while (!opj_tgt_decode(l_bio, l_prc->imsbtree, cblkno, (OPJ_INT32)i)) {
                    ++i;
                }

                l_cblk->numbps = (OPJ_UINT32)l_band->numbps + 1 - i;
                l_cblk->numlenbits = 3;
            }

            /* number of coding passes */
            l_cblk->numnewpasses = opj_t2_getnumpasses(l_bio);
            l_increment = opj_t2_getcommacode(l_bio);

            /* length indicator increment */
            l_cblk->numlenbits += l_increment;
            l_segno = 0;

            if (!l_cblk->numsegs) {
                if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
            } else {
                l_segno = l_cblk->numsegs - 1;
                if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
                    ++l_segno;
                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            }
            n = (OPJ_INT32)l_cblk->numnewpasses;

            do {
                OPJ_UINT32 bit_number;
                l_cblk->segs[l_segno].numnewpasses = (OPJ_UINT32)opj_int_min((OPJ_INT32)(
                        l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses), n);
                bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                 l_cblk->segs[l_segno].numnewpasses);
                if (bit_number > 32) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                  bit_number);
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
                l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                            l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                            l_cblk->segs[l_segno].newlen);

                n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                if (n > 0) {
                    ++l_segno;

                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            } while (n > 0);

            ++l_cblk;
        }
    }

    if (!opj_bio_inalign(l_bio)) {
        opj_bio_destroy(l_bio);
        return OPJ_FALSE;
    }

    l_header_data += opj_bio_numbytes(l_bio);
    opj_bio_destroy(l_bio);

    /* EPH markers */
    if (p_tcp->csty & J2K_CP_CSTY_EPH) {
        if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                *l_header_data_start)) < 2U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected EPH marker\n");
        } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
        } else {
            l_header_data += 2;
        }
    }

    l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
    JAS_FPRINTF(stderr, "hdrlen=%d \n", l_header_length);
    JAS_FPRINTF(stderr, "packet body\n");
    *l_modified_length_ptr -= l_header_length;
    *l_header_data_start += l_header_length;

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
     Will be updated later by incrementing with packet start value */
    if (p_pack_info) {
        p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
    }
    /* INDEX >> */

    *p_is_data_present = OPJ_TRUE;
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);

    return OPJ_TRUE;
}